

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

void __thiscall TimerTest_syncrhonizedTimers_Test::TestBody(TimerTest_syncrhonizedTimers_Test *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int timers_running;
  unique_lock<std::mutex> lock;
  syncrhonized_timer timer_obj;
  condition_variable notifier;
  mutex notifier_mutex;
  int local_bc;
  undefined1 local_b8 [16];
  int local_a8;
  undefined4 uStack_a4;
  AssertHelper local_a0 [8];
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  syncrhonized_timer local_78;
  condition_variable local_68 [48];
  __native_type local_38;
  
  std::condition_variable::condition_variable(local_68);
  local_38._16_8_ = 0;
  local_38.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_38.__align = 0;
  local_38._8_8_ = 0;
  local_38.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_bc = 0;
  local_98 = (undefined8 *)0x0;
  uStack_90 = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98 = (undefined8 *)operator_new(0x18);
  *local_98 = local_68;
  local_98[1] = &local_38;
  local_98[2] = &local_bc;
  pcStack_80 = std::
               _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:196:39)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:196:39)>
             ::_M_manager;
  jessilib::syncrhonized_timer::syncrhonized_timer(&local_78,1000000);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  local_b8._0_8_ = (mutex_type *)0x0;
  local_b8._8_8_ = &LAB_002dc6c0;
  do {
    iVar1 = nanosleep((timespec *)local_b8,(timespec *)local_b8);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_a8 = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"timers_running","1",&local_bc,&local_a8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)local_b8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)CONCAT44(uStack_a4,local_a8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_a4,local_a8) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  std::condition_variable::notify_all();
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &local_38;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
  local_b8[8] = 1;
  if (local_bc != 0) {
    do {
      std::condition_variable::wait((unique_lock *)local_68);
    } while (local_bc != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
  if (local_78.super_timer.m_context.
      super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super_timer.m_context.
               super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::condition_variable::~condition_variable(local_68);
  return;
}

Assistant:

TEST(TimerTest, syncrhonizedTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;

	// Spin up timer
	syncrhonized_timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running](timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_one();
		in_timer.cancel();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period * 3);
	EXPECT_EQ(timers_running, 1);

	// Notify timers to close
	notifier.notify_all();

	// Wait for timers to complete
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}